

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picohttpparser.c
# Opt level: O0

char * is_complete(char *buf,char *buf_end,size_t last_len,int *ret)

{
  char *pcVar1;
  char *local_40;
  int local_34;
  int ret_cnt;
  int *ret_local;
  size_t last_len_local;
  char *buf_end_local;
  char *buf_local;
  
  local_34 = 0;
  local_40 = buf;
  if (2 < last_len) {
    local_40 = buf + (last_len - 3);
  }
  buf_end_local = local_40;
  do {
    if (buf_end_local == buf_end) {
      *ret = -2;
      return (char *)0x0;
    }
    if (*buf_end_local == '\r') {
      pcVar1 = buf_end_local + 1;
      if (pcVar1 == buf_end) {
        *ret = -2;
        return (char *)0x0;
      }
      if (pcVar1 == buf_end) {
        *ret = -2;
        return (char *)0x0;
      }
      buf_end_local = buf_end_local + 2;
      if (*pcVar1 != '\n') {
        *ret = -1;
        return (char *)0x0;
      }
      local_34 = local_34 + 1;
    }
    else {
      if (*buf_end_local == '\n') {
        local_34 = local_34 + 1;
      }
      else {
        local_34 = 0;
      }
      buf_end_local = buf_end_local + 1;
    }
    if (local_34 == 2) {
      return buf_end_local;
    }
  } while( true );
}

Assistant:

static const char *is_complete(const char *buf, const char *buf_end, size_t last_len, int *ret)
{
    int ret_cnt = 0;
    buf = last_len < 3 ? buf : buf + last_len - 3;

    while (1) {
        CHECK_EOF();
        if (*buf == '\015') {
            ++buf;
            CHECK_EOF();
            EXPECT_CHAR('\012');
            ++ret_cnt;
        } else if (*buf == '\012') {
            ++buf;
            ++ret_cnt;
        } else {
            ++buf;
            ret_cnt = 0;
        }
        if (ret_cnt == 2) {
            return buf;
        }
    }

    *ret = -2;
    return NULL;
}